

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O0

err_t btokCVCWrap(octet *cert,size_t *cert_len,btok_cvc_t *cvc,octet *privkey,size_t privkey_len)

{
  bool_t bVar1;
  err_t eVar2;
  size_t sVar3;
  long lVar4;
  octet *der;
  octet *val;
  octet *poVar5;
  der_anchor_t *anchor;
  void *in_RCX;
  void *in_RDX;
  long *in_RSI;
  long in_RDI;
  ulong in_R8;
  size_t t;
  size_t count;
  der_anchor_t CVCert [1];
  err_t code;
  size_t in_stack_000000d8;
  octet *in_stack_000000e0;
  octet *in_stack_000000e8;
  size_t in_stack_00000128;
  octet *in_stack_00000130;
  size_t in_stack_00000138;
  void *in_stack_00000140;
  octet *in_stack_00000148;
  btok_cvc_t *in_stack_000001a0;
  octet *in_stack_000001a8;
  btok_cvc_t *in_stack_ffffffffffffff78;
  octet *in_stack_ffffffffffffff80;
  der_anchor_t *in_stack_ffffffffffffff88;
  long lVar6;
  long lVar7;
  octet *in_stack_ffffffffffffffa8;
  err_t local_4;
  u32 tag;
  
  lVar7 = 0;
  bVar1 = memIsValid(in_RDX,0x128);
  if ((((bVar1 == 0) ||
       ((((in_R8 != 0x18 && (in_R8 != 0x20)) && (in_R8 != 0x30)) && (in_R8 != 0x40)))) ||
      (bVar1 = memIsValid(in_RCX,in_R8), bVar1 == 0)) ||
     ((in_RSI != (long *)0x0 && (bVar1 = memIsValid(in_RSI,8), bVar1 == 0)))) {
    local_4 = 0x6d;
  }
  else {
    if (*(long *)((long)in_RDX + 0xa0) == 0) {
      eVar2 = btokPubkeyCalc(in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
      if (eVar2 != 0) {
        return eVar2;
      }
      *(ulong *)((long)in_RDX + 0xa0) = in_R8 << 1;
      memSet(in_stack_ffffffffffffff80,(octet)((ulong)in_stack_ffffffffffffff78 >> 0x38),0x16fde0);
    }
    local_4 = btokCVCCheck(in_stack_ffffffffffffff78);
    if (local_4 == 0) {
      sVar3 = derTSEQEncStart(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                              (size_t)in_stack_ffffffffffffff78,0);
      if (in_RDI == 0) {
        lVar4 = 0;
      }
      else {
        lVar4 = in_RDI + sVar3;
      }
      lVar7 = sVar3 + lVar7;
      lVar6 = lVar4;
      der = (octet *)btokCVCBodyEnc(in_stack_000001a8,in_stack_000001a0);
      tag = (u32)((ulong)lVar6 >> 0x20);
      if ((lVar4 == 0) ||
         (local_4 = btokSign(in_stack_00000148,in_stack_00000140,in_stack_00000138,in_stack_00000130
                             ,in_stack_00000128), local_4 == 0)) {
        if (lVar4 == 0) {
          val = (octet *)0x0;
        }
        else {
          val = der + lVar4;
        }
        poVar5 = der + lVar7;
        if (in_R8 == 0x18) {
          *(undefined8 *)((long)in_RDX + 0x120) = 0x22;
        }
        else {
          *(ulong *)((long)in_RDX + 0x120) = in_R8 + (in_R8 >> 1);
        }
        anchor = (der_anchor_t *)derEnc(der,tag,val,(size_t)in_stack_ffffffffffffff80);
        poVar5 = poVar5 + (long)&anchor->der;
        sVar3 = derTSEQEncStop(in_stack_ffffffffffffffa8,(size_t)poVar5,anchor);
        if (in_RSI != (long *)0x0) {
          *in_RSI = (long)(poVar5 + sVar3);
        }
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

err_t btokCVCWrap(octet cert[], size_t* cert_len, btok_cvc_t* cvc,
	const octet privkey[], size_t privkey_len)
{
	err_t code;
	der_anchor_t CVCert[1];
	size_t count = 0;
	size_t t;
	// проверить входные данные
	if (!memIsValid(cvc, sizeof(btok_cvc_t)) ||
		privkey_len != 24 && 
			privkey_len != 32 && privkey_len != 48 && privkey_len != 64 ||
		!memIsValid(privkey, privkey_len) ||
		!memIsNullOrValid(cert_len, O_PER_S))
		return ERR_BAD_INPUT;
	// построить открытый ключ
	if (cvc->pubkey_len == 0)
	{
		code = btokPubkeyCalc(cvc->pubkey, privkey, privkey_len);
		ERR_CALL_CHECK(code);
		cvc->pubkey_len = 2 * privkey_len;
		memSetZero(cvc->pubkey + cvc->pubkey_len,
			sizeof(cvc->pubkey) - cvc->pubkey_len);
	}
	// проверить содержимое сертификата
	code = btokCVCCheck(cvc);
	ERR_CALL_CHECK(code);
	// начать кодирование...
	t = derTSEQEncStart(CVCert, cert, count, 0x7F21);
	ASSERT(t != SIZE_MAX);
	cert = cert ? cert + t : 0, count += t;
	// ...кодировать и подписать основную часть...
	t = btokCVCBodyEnc(cert, cvc);
	ASSERT(t != SIZE_MAX);
	if (cert)
	{
		code = btokSign(cvc->sig, cert, t, privkey, privkey_len);
		ERR_CALL_CHECK(code);
	}
	cert = cert ? cert + t : 0, count += t;
	if (privkey_len == 24)
		cvc->sig_len = 34;
	else
		cvc->sig_len = privkey_len + privkey_len / 2;
	// ...кодировать подпись...
	t = derTOCTEnc(cert, 0x5F37, cvc->sig, cvc->sig_len);
	ASSERT(t != SIZE_MAX);
	cert = cert ? cert + t : 0, count += t;
	// ...завершить кодирование
	t = derTSEQEncStop(cert, count, CVCert);
	ASSERT(t != SIZE_MAX);
	cert = cert ? cert + t : 0, count += t;
	// возвратить длину DER-кода
	if (cert_len)
		*cert_len = count;
	return ERR_OK;
}